

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O3

int CBB_add_asn1_uint64_with_tag(CBB *cbb,uint64_t value,CBS_ASN1_TAG tag)

{
  bool bVar1;
  int iVar2;
  anon_union_32_2_4f6aaa2e_for_u *paVar3;
  size_t i;
  long lVar4;
  char cVar5;
  ulong uVar6;
  CBB child;
  CBB CStack_58;
  
  iVar2 = CBB_add_asn1(cbb,&CStack_58,tag);
  if (iVar2 != 0) {
    bVar1 = true;
    lVar4 = 0;
    do {
      while( true ) {
        uVar6 = value >> ((char)lVar4 * -8 + 0x38U & 0x3f);
        cVar5 = (char)uVar6;
        if (bVar1) break;
LAB_004bbee3:
        iVar2 = cbb_add_u(&CStack_58,uVar6 & 0xff,1);
        if (iVar2 == 0) goto LAB_004bbf2d;
        lVar4 = lVar4 + 1;
        bVar1 = false;
        if (lVar4 == 8) goto LAB_004bbf23;
      }
      if (cVar5 != '\0') {
        if ((-1 < cVar5) || (iVar2 = cbb_add_u(&CStack_58,0,1), iVar2 != 0)) goto LAB_004bbee3;
        goto LAB_004bbf2d;
      }
      lVar4 = lVar4 + 1;
      bVar1 = true;
    } while (lVar4 != 8);
    iVar2 = cbb_add_u(&CStack_58,0,1);
    if (iVar2 != 0) {
LAB_004bbf23:
      iVar2 = CBB_flush(cbb);
      return iVar2;
    }
  }
LAB_004bbf2d:
  paVar3 = &cbb->u;
  if (cbb->is_child != '\0') {
    paVar3 = (anon_union_32_2_4f6aaa2e_for_u *)(paVar3->base).buf;
  }
  *(byte *)((long)paVar3 + 0x18) = *(byte *)((long)paVar3 + 0x18) | 2;
  cbb->child = (CBB *)0x0;
  return 0;
}

Assistant:

int CBB_add_asn1_uint64_with_tag(CBB *cbb, uint64_t value, CBS_ASN1_TAG tag) {
  CBB child;
  int started = 0;
  if (!CBB_add_asn1(cbb, &child, tag)) {
    goto err;
  }

  for (size_t i = 0; i < 8; i++) {
    uint8_t byte = (value >> 8 * (7 - i)) & 0xff;
    if (!started) {
      if (byte == 0) {
        // Don't encode leading zeros.
        continue;
      }
      // If the high bit is set, add a padding byte to make it
      // unsigned.
      if ((byte & 0x80) && !CBB_add_u8(&child, 0)) {
        goto err;
      }
      started = 1;
    }
    if (!CBB_add_u8(&child, byte)) {
      goto err;
    }
  }

  // 0 is encoded as a single 0, not the empty string.
  if (!started && !CBB_add_u8(&child, 0)) {
    goto err;
  }

  return CBB_flush(cbb);

err:
  cbb_on_error(cbb);
  return 0;
}